

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>::fastAccessDx
          (FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_> *this,int i)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined8 *in_RDI;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  int in_stack_ffffffffffffffbc;
  Fad<double> *in_stack_ffffffffffffffc0;
  
  pdVar3 = Fad<double>::fastAccessDx(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  dVar1 = *pdVar3;
  vVar4 = FadExpr<FadFuncCosh<Fad<double>_>_>::val((FadExpr<FadFuncCosh<Fad<double>_>_> *)0x1efea5e)
  ;
  vVar5 = FadExpr<FadFuncCosh<Fad<double>_>_>::fastAccessDx
                    ((FadExpr<FadFuncCosh<Fad<double>_>_> *)in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbc);
  pdVar3 = Fad<double>::val((Fad<double> *)*in_RDI);
  dVar2 = *pdVar3;
  vVar6 = FadExpr<FadFuncCosh<Fad<double>_>_>::val((FadExpr<FadFuncCosh<Fad<double>_>_> *)0x1efead5)
  ;
  vVar7 = FadExpr<FadFuncCosh<Fad<double>_>_>::val((FadExpr<FadFuncCosh<Fad<double>_>_> *)0x1efeae9)
  ;
  return (dVar1 * vVar4 + -(vVar5 * dVar2)) / (vVar6 * vVar7);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}